

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O2

asn_enc_rval_t *
SET_OF_encode_xer(asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,
                 int ilevel,xer_encoder_flags_e flags,asn_app_consume_bytes_f *cb,void *app_key)

{
  asn_TYPE_member_s *paVar1;
  void *pvVar2;
  void *pvVar3;
  char *__s;
  ssize_t sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 *__base;
  size_t sVar8;
  long lVar9;
  undefined8 *puVar10;
  asn_app_consume_bytes_f *paVar11;
  size_t __nmemb;
  int iVar12;
  char *__s_00;
  bool bVar13;
  long local_d0;
  size_t local_b8;
  asn_enc_rval_t local_48;
  
  paVar1 = td->elements;
  pvVar2 = td->specifics;
  bVar13 = true;
  if ((*(int *)((long)pvVar2 + 8) == 0) &&
     ((__s_00 = paVar1->name, *__s_00 != '\0' ||
      (__s_00 = paVar1->type->xml_tag, __s_00 != (char *)0x0)))) {
    local_b8 = strlen(__s_00);
    bVar13 = false;
  }
  else {
    __s_00 = (char *)0x0;
    local_b8 = 0;
  }
  if (sptr == (void *)0x0) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
    return __return_storage_ptr__;
  }
  if ((flags & XER_F_CANONICAL) == 0) {
    __base = (undefined8 *)0x0;
    paVar11 = cb;
  }
  else {
    __base = (undefined8 *)malloc((long)*(int *)((long)sptr + 8) * 0x18);
    if (__base == (undefined8 *)0x0) {
      __return_storage_ptr__->encoded = -1;
      __return_storage_ptr__->failed_type = td;
      __return_storage_ptr__->structure_ptr = sptr;
      return __return_storage_ptr__;
    }
    paVar11 = SET_OF_encode_xer_callback;
  }
  lVar9 = 0;
  iVar6 = 0;
  if (0 < ilevel) {
    iVar6 = ilevel;
  }
  iVar7 = -1;
  if (-1 < ilevel) {
    iVar7 = ilevel;
  }
  __nmemb = 0;
  local_d0 = 0;
  puVar10 = (undefined8 *)app_key;
  for (; lVar9 < *(int *)((long)sptr + 8); lVar9 = lVar9 + 1) {
    pvVar3 = *(void **)(*sptr + lVar9 * 8);
    if (pvVar3 != (void *)0x0) {
      if (__base != (undefined8 *)0x0) {
        puVar10 = __base + __nmemb * 3;
        __base[__nmemb * 3] = 0;
        (__base + __nmemb * 3)[1] = 0;
        __base[__nmemb * 3 + 2] = 0;
        __nmemb = __nmemb + 1;
      }
      if (!bVar13) {
        if ((flags & XER_F_CANONICAL) == 0) {
          iVar5 = (*paVar11)("\n",1,puVar10);
          iVar12 = iVar6 + 1;
          while( true ) {
            if (iVar5 < 0) goto LAB_00145b41;
            iVar12 = iVar12 + -1;
            if (iVar12 == 0) break;
            iVar5 = (*paVar11)("    ",4,puVar10);
          }
          local_d0 = local_d0 + (ulong)(iVar6 * 4 + 1);
        }
        iVar12 = (*paVar11)("<",1,puVar10);
        if (((iVar12 < 0) || (iVar12 = (*paVar11)(__s_00,local_b8,puVar10), iVar12 < 0)) ||
           (iVar12 = (*paVar11)(">",1,puVar10), iVar12 < 0)) goto LAB_00145b41;
      }
      iVar12 = *(int *)((long)pvVar2 + 8);
      if (iVar12 == 1 && (flags & XER_F_CANONICAL) == 0) {
        iVar5 = (*paVar11)("\n",1,puVar10);
        iVar12 = iVar7 + 2;
        while( true ) {
          if (iVar5 < 0) goto LAB_00145b41;
          iVar12 = iVar12 + -1;
          if (iVar12 == 0) break;
          iVar5 = (*paVar11)("    ",4,puVar10);
        }
        local_d0 = local_d0 + (iVar7 * 4 + 5);
        iVar12 = *(int *)((long)pvVar2 + 8);
      }
      (*paVar1->type->xer_encoder)
                (&local_48,paVar1->type,pvVar3,(uint)(iVar12 != 2) + ilevel,flags,paVar11,puVar10);
      sVar4 = local_48.encoded;
      if (local_48.encoded == 0) {
        if (*(int *)((long)pvVar2 + 8) != 0) {
          __s = paVar1->type->xml_tag;
          sVar8 = strlen(__s);
          iVar12 = (*paVar11)("<",1,puVar10);
          if (((iVar12 < 0) || (iVar12 = (*paVar11)(__s,sVar8,puVar10), iVar12 < 0)) ||
             (iVar12 = (*paVar11)("/>",2,puVar10), iVar12 < 0)) goto LAB_00145b41;
        }
      }
      else if (local_48.encoded == -1) {
        lVar9 = -1;
        goto LAB_00145b44;
      }
      if (!bVar13) {
        iVar12 = (*paVar11)("</",2,puVar10);
        if (((iVar12 < 0) || (iVar12 = (*paVar11)(__s_00,local_b8,puVar10), iVar12 < 0)) ||
           (iVar12 = (*paVar11)(">",1,puVar10), iVar12 < 0)) goto LAB_00145b41;
        local_d0 = local_d0 + 5;
      }
      local_d0 = local_d0 + sVar4 + local_b8 * 2;
    }
  }
  if ((flags & XER_F_CANONICAL) == 0) {
    iVar6 = (*paVar11)("\n",1,puVar10);
    if (-1 < iVar6) {
      iVar6 = 1;
      if (1 < ilevel) {
        iVar6 = ilevel;
      }
      iVar7 = iVar6 + -1;
      do {
        iVar6 = iVar6 + -1;
        if (iVar6 == 0) {
          local_d0 = local_d0 + (iVar7 * 4 + 1);
          goto LAB_00145bc9;
        }
        iVar12 = (*paVar11)("    ",4,puVar10);
      } while (-1 < iVar12);
    }
LAB_00145b41:
    lVar9 = -1;
  }
  else {
LAB_00145bc9:
    if (__base == (undefined8 *)0x0) goto LAB_00145b71;
    qsort(__base,__nmemb,0x18,SET_OF_xer_order);
    puVar10 = __base;
    while ((lVar9 = local_d0, puVar10 < __base + __nmemb * 3 &&
           (iVar6 = (*cb)((void *)*puVar10,puVar10[1],app_key), lVar9 = -1, -1 < iVar6))) {
      free((void *)*puVar10);
      *puVar10 = 0;
      puVar10 = puVar10 + 3;
    }
  }
LAB_00145b44:
  local_d0 = lVar9;
  if (__base != (undefined8 *)0x0) {
    puVar10 = __base + __nmemb * 3;
    while( true ) {
      puVar10 = puVar10 + -3;
      bVar13 = __nmemb == 0;
      __nmemb = __nmemb - 1;
      if (bVar13) break;
      free((void *)*puVar10);
    }
    free(__base);
  }
LAB_00145b71:
  __return_storage_ptr__->encoded = local_d0;
  __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
  __return_storage_ptr__->structure_ptr = (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
SET_OF_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	asn_enc_rval_t er;
	asn_SET_OF_specifics_t *specs = (asn_SET_OF_specifics_t *)td->specifics;
	asn_TYPE_member_t *elm = td->elements;
	asn_anonymous_set_ *list = _A_SET_FROM_VOID(sptr);
	const char *mname = specs->as_XMLValueList
		? 0 : ((*elm->name) ? elm->name : elm->type->xml_tag);
	size_t mlen = mname ? strlen(mname) : 0;
	int xcan = (flags & XER_F_CANONICAL);
	xer_tmp_enc_t *encs = 0;
	size_t encs_count = 0;
	void *original_app_key = app_key;
	asn_app_consume_bytes_f *original_cb = cb;
	int i;

	if(!sptr) ASN__ENCODE_FAILED;

	if(xcan) {
		encs = (xer_tmp_enc_t *)MALLOC(list->count * sizeof(encs[0]));
		if(!encs) ASN__ENCODE_FAILED;
		cb = SET_OF_encode_xer_callback;
	}

	er.encoded = 0;

	for(i = 0; i < list->count; i++) {
		asn_enc_rval_t tmper;

		void *memb_ptr = list->array[i];
		if(!memb_ptr) continue;

		if(encs) {
			memset(&encs[encs_count], 0, sizeof(encs[0]));
			app_key = &encs[encs_count];
			encs_count++;
		}

		if(mname) {
			if(!xcan) ASN__TEXT_INDENT(1, ilevel);
			ASN__CALLBACK3("<", 1, mname, mlen, ">", 1);
		}

		if(!xcan && specs->as_XMLValueList == 1)
			ASN__TEXT_INDENT(1, ilevel + 1);
		tmper = elm->type->xer_encoder(elm->type, memb_ptr,
				ilevel + (specs->as_XMLValueList != 2),
				flags, cb, app_key);
		if(tmper.encoded == -1) {
			td = tmper.failed_type;
			sptr = tmper.structure_ptr;
			goto cb_failed;
		}
		if(tmper.encoded == 0 && specs->as_XMLValueList) {
			const char *name = elm->type->xml_tag;
			size_t len = strlen(name);
			ASN__CALLBACK3("<", 1, name, len, "/>", 2);
		}

		if(mname) {
			ASN__CALLBACK3("</", 2, mname, mlen, ">", 1);
			er.encoded += 5;
		}

		er.encoded += (2 * mlen) + tmper.encoded;
	}

	if(!xcan) ASN__TEXT_INDENT(1, ilevel - 1);

	if(encs) {
		xer_tmp_enc_t *enc = encs;
		xer_tmp_enc_t *end = encs + encs_count;
		ssize_t control_size = 0;

		cb = original_cb;
		app_key = original_app_key;
		qsort(encs, encs_count, sizeof(encs[0]), SET_OF_xer_order);

		for(; enc < end; enc++) {
			ASN__CALLBACK(enc->buffer, enc->offset);
			FREEMEM(enc->buffer);
			enc->buffer = 0;
			control_size += enc->offset;
		}
		assert(control_size == er.encoded);
	}

	goto cleanup;
cb_failed:
	er.encoded = -1;
	er.failed_type = td;
	er.structure_ptr = sptr;
cleanup:
	if(encs) {
		while(encs_count-- > 0) {
			if(encs[encs_count].buffer)
				FREEMEM(encs[encs_count].buffer);
		}
		FREEMEM(encs);
	}
	ASN__ENCODED_OK(er);
}